

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

fdb_status sb_init(filemgr *file,sb_config sconfig,err_log_callback *log_callback)

{
  fdb_status fVar1;
  superblock *sb;
  sb_config *psVar2;
  bid_t bVar3;
  size_t sb_no;
  
  fVar1 = FDB_RESULT_SUCCESS;
  if ((file->sb == (superblock *)0x0) &&
     (fVar1 = FDB_RESULT_SB_INIT_FAIL, (file->pos).super___atomic_base<unsigned_long>._M_i == 0)) {
    sb = (superblock *)calloc(1,200);
    file->sb = sb;
    psVar2 = (sb_config *)calloc(1,1);
    sb->config = psVar2;
    file->version = 0xdeadcafebeefc002;
    _sb_init(sb,sconfig);
    fVar1 = FDB_RESULT_SUCCESS;
    if (file->sb->config->num_sb != '\0') {
      sb_no = 0;
      while (bVar3 = filemgr_alloc(file,log_callback), sb_no == bVar3) {
        fVar1 = sb_write(file,sb_no,log_callback);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          return fVar1;
        }
        sb_no = sb_no + 1;
        if (file->sb->config->num_sb <= sb_no) {
          return FDB_RESULT_SUCCESS;
        }
      }
      fVar1 = FDB_RESULT_SB_RACE_CONDITION;
      fdb_log_impl(log_callback,2,FDB_RESULT_SB_RACE_CONDITION,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                   ,"sb_init",0x6fa,"Other writer interfered during sb_write (number: %lu)",sb_no);
      free(file->sb->config);
      free(file->sb);
    }
  }
  return fVar1;
}

Assistant:

fdb_status sb_init(struct filemgr *file, struct sb_config sconfig,
                   err_log_callback * log_callback)
{
    size_t i;
    bid_t sb_bid;
    fdb_status fs;

    // exit if superblock already exists.
    if (file->sb) {
        return FDB_RESULT_SUCCESS;
    }
    // no data should be written in the file before initialization of superblock.
    if (filemgr_get_pos(file) > 0) {
        return FDB_RESULT_SB_INIT_FAIL;
    }

    file->sb = (struct superblock*)calloc(1, sizeof(struct superblock));
    file->sb->config = (struct sb_config*)calloc(1, sizeof(struct sb_config));
    file->version = ver_get_latest_magic();
    _sb_init(file->sb, sconfig);

    // write initial superblocks
    for (i=0; i<file->sb->config->num_sb; ++i) {
        // allocate
        sb_bid = filemgr_alloc(file, log_callback);
        if (sb_bid != i) {
            // other data was written during sb_write .. error
            fs = FDB_RESULT_SB_RACE_CONDITION;
            fdb_log(log_callback, FDB_LOG_ERROR, fs,
                    "Other writer interfered during sb_write (number: %" _F64 ")",
                    i);
            free(file->sb->config);
            free(file->sb);
            return fs;
        }

        fs = sb_write(file, i, log_callback);
        if (fs != FDB_RESULT_SUCCESS) {
            return fs;
        }
    }

    return FDB_RESULT_SUCCESS;
}